

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CTandCTOTReadCoder(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *__return_storage_ptr__,string *reference,string *sequence,
                    vector<int,_std::allocator<int>_> *qualityList,char char1,char char2,char char3)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long *plVar10;
  undefined8 *puVar11;
  uint uVar12;
  size_type *psVar13;
  ulong uVar14;
  char *__end;
  ulong uVar15;
  char cVar16;
  undefined7 in_register_00000089;
  uint __uval;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  uint __uval_2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string codedReadQualities;
  string codedRead;
  uint local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [20];
  undefined4 local_bc;
  ulong local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  vector<int,_std::allocator<int>_> *local_90;
  string *local_88;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  ulong local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_bc = (undefined4)CONCAT71(in_register_00000089,char2);
  local_60 = local_50;
  local_90 = qualityList;
  local_88 = reference;
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"","");
  local_108 = (uint)qualityList;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"","");
  uVar14 = sequence->_M_string_length;
  if (uVar14 == 2) {
    uVar20 = 0;
    local_108 = 0;
  }
  else {
    uVar18 = 0;
    uVar9 = 0;
    uVar20 = 0;
    do {
      uVar19 = uVar18;
      if (uVar14 <= uVar18) goto LAB_0016471c;
      uVar12 = uVar20 + 1;
      pcVar3 = (sequence->_M_dataplus)._M_p;
      if (pcVar3[uVar18] == char1) {
        lVar21 = (long)(int)uVar9;
        uVar15 = lVar21 + 1;
        if (uVar14 <= uVar15) {
LAB_001646fd:
          uVar19 = lVar21 + 1;
          goto LAB_0016471c;
        }
        cVar16 = (char)local_bc;
        cVar6 = (char)((int)uVar20 >> 0x1f);
        if (pcVar3[uVar15] != cVar16) {
LAB_001636c0:
          if (pcVar3[uVar18] == char1) {
            uVar15 = lVar21 + 1;
            if (uVar14 <= uVar15) goto LAB_001646fd;
            if (pcVar3[uVar15] == char3) {
              uVar19 = lVar21 + 2;
              if (uVar14 <= uVar19) goto LAB_0016471c;
              if (pcVar3[uVar19] != char1) {
                uVar14 = local_88->_M_string_length;
                if (uVar15 < uVar14) {
                  pcVar3 = (local_88->_M_dataplus)._M_p;
                  if (pcVar3[uVar15] == cVar16) {
                    uVar19 = uVar18;
                    if (uVar14 <= uVar18) goto LAB_0016471c;
                    if (pcVar3[uVar18] == char1) {
                      if (uVar20 == 0) {
                        std::__cxx11::string::append((char *)&local_60);
                      }
                      else {
                        uVar12 = -uVar20;
                        if (0 < (int)uVar20) {
                          uVar12 = uVar20;
                        }
                        uVar17 = 1;
                        if (9 < uVar12) {
                          uVar14 = (ulong)uVar12;
                          uVar8 = 4;
                          do {
                            uVar17 = uVar8;
                            uVar7 = (uint)uVar14;
                            if (uVar7 < 100) {
                              uVar17 = uVar17 - 2;
                              goto LAB_00163e36;
                            }
                            if (uVar7 < 1000) {
                              uVar17 = uVar17 - 1;
                              goto LAB_00163e36;
                            }
                            if (uVar7 < 10000) goto LAB_00163e36;
                            uVar14 = uVar14 / 10000;
                            uVar8 = uVar17 + 4;
                          } while (99999 < uVar7);
                          uVar17 = uVar17 + 1;
                        }
LAB_00163e36:
                        local_b8 = CONCAT44(local_b8._4_4_,uVar12);
                        uVar20 = -((int)uVar20 >> 0x1f);
                        local_b0[0] = local_a0;
                        std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar17 - cVar6);
                        local_40 = (ulong)uVar20;
                        std::__detail::__to_chars_10_impl<unsigned_int>
                                  (local_b0[0] + local_40,uVar17,(uint)local_b8);
                        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_b0);
                        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                        psVar13 = puVar11 + 2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*puVar11 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar13) {
                          local_100.field_2._M_allocated_capacity = *psVar13;
                          local_100.field_2._8_8_ = puVar11[3];
                        }
                        else {
                          local_100.field_2._M_allocated_capacity = *psVar13;
                          local_100._M_dataplus._M_p = (pointer)*puVar11;
                        }
                        uVar12 = (uint)local_b8;
                        local_100._M_string_length = puVar11[1];
                        *puVar11 = psVar13;
                        puVar11[1] = 0;
                        *(undefined1 *)(puVar11 + 2) = 0;
                        std::__cxx11::string::_M_append
                                  ((char *)&local_60,(ulong)local_100._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_100._M_dataplus._M_p != &local_100.field_2) {
                          operator_delete(local_100._M_dataplus._M_p);
                        }
                        if (local_b0[0] != local_a0) {
                          operator_delete(local_b0[0]);
                        }
                        uVar17 = 1;
                        if (9 < uVar12) {
                          uVar8 = uVar12;
                          uVar7 = 4;
                          do {
                            uVar17 = uVar7;
                            if (uVar8 < 100) {
                              uVar17 = uVar17 - 2;
                              goto LAB_00163f62;
                            }
                            if (uVar8 < 1000) {
                              uVar17 = uVar17 - 1;
                              goto LAB_00163f62;
                            }
                            if (uVar8 < 10000) goto LAB_00163f62;
                            bVar5 = 99999 < uVar8;
                            uVar8 = uVar8 / 10000;
                            uVar7 = uVar17 + 4;
                          } while (bVar5);
                          uVar17 = uVar17 + 1;
                        }
LAB_00163f62:
                        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                        std::__cxx11::string::_M_construct
                                  ((ulong)&local_100,(char)uVar20 + (char)uVar17);
                        std::__detail::__to_chars_10_impl<unsigned_int>
                                  (local_100._M_dataplus._M_p + local_40,uVar17,uVar12);
                        std::__cxx11::string::_M_append
                                  ((char *)&local_80,(ulong)local_100._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_100._M_dataplus._M_p != &local_100.field_2) {
                          operator_delete(local_100._M_dataplus._M_p);
                        }
                      }
                      std::__cxx11::string::push_back((char)&local_80);
                      goto LAB_00163fdd;
                    }
                  }
                  goto LAB_0016419b;
                }
                goto LAB_001646fd;
              }
            }
          }
          goto LAB_001636ff;
        }
        uVar19 = lVar21 + 2;
        if (uVar14 <= uVar19) goto LAB_0016471c;
        if (pcVar3[uVar19] == char1) goto LAB_001636c0;
        uVar14 = local_88->_M_string_length;
        if (uVar14 <= uVar15) goto LAB_001646fd;
        pcVar3 = (local_88->_M_dataplus)._M_p;
        if (pcVar3[uVar15] == cVar16) {
          uVar19 = uVar18;
          if (uVar14 <= uVar18) goto LAB_0016471c;
          if (pcVar3[uVar18] != char1) goto LAB_0016419b;
          if (uVar20 == 0) {
            std::__cxx11::string::append((char *)&local_60);
          }
          else {
            uVar12 = -uVar20;
            if (0 < (int)uVar20) {
              uVar12 = uVar20;
            }
            uVar17 = 1;
            if (9 < uVar12) {
              uVar14 = (ulong)uVar12;
              uVar8 = 4;
              do {
                uVar17 = uVar8;
                uVar7 = (uint)uVar14;
                if (uVar7 < 100) {
                  uVar17 = uVar17 - 2;
                  goto LAB_00163ad9;
                }
                if (uVar7 < 1000) {
                  uVar17 = uVar17 - 1;
                  goto LAB_00163ad9;
                }
                if (uVar7 < 10000) goto LAB_00163ad9;
                uVar14 = uVar14 / 10000;
                uVar8 = uVar17 + 4;
              } while (99999 < uVar7);
              uVar17 = uVar17 + 1;
            }
LAB_00163ad9:
            local_b8 = CONCAT44(local_b8._4_4_,uVar12);
            uVar20 = -((int)uVar20 >> 0x1f);
            local_b0[0] = local_a0;
            std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar17 - cVar6);
            local_40 = (ulong)uVar20;
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_b0[0] + local_40,uVar17,(uint)local_b8);
            plVar10 = (long *)std::__cxx11::string::append((char *)local_b0);
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            psVar13 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_100.field_2._M_allocated_capacity = *psVar13;
              local_100.field_2._8_8_ = plVar10[3];
            }
            else {
              local_100.field_2._M_allocated_capacity = *psVar13;
              local_100._M_dataplus._M_p = (pointer)*plVar10;
            }
            uVar12 = (uint)local_b8;
            local_100._M_string_length = plVar10[1];
            *plVar10 = (long)psVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_100._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p);
            }
            if (local_b0[0] != local_a0) {
              operator_delete(local_b0[0]);
            }
            uVar17 = 1;
            if (9 < uVar12) {
              uVar8 = uVar12;
              uVar7 = 4;
              do {
                uVar17 = uVar7;
                if (uVar8 < 100) {
                  uVar17 = uVar17 - 2;
                  goto LAB_00163c05;
                }
                if (uVar8 < 1000) {
                  uVar17 = uVar17 - 1;
                  goto LAB_00163c05;
                }
                if (uVar8 < 10000) goto LAB_00163c05;
                bVar5 = 99999 < uVar8;
                uVar8 = uVar8 / 10000;
                uVar7 = uVar17 + 4;
              } while (bVar5);
              uVar17 = uVar17 + 1;
            }
LAB_00163c05:
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar20 + (char)uVar17);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_100._M_dataplus._M_p + local_40,uVar17,uVar12);
            std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_100._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p);
            }
          }
          std::__cxx11::string::push_back((char)&local_80);
LAB_00163fdd:
          uVar9 = lVar21 + 1U & 0xffffffff;
          uVar12 = 0;
          goto LAB_001636ff;
        }
      }
      else {
LAB_001636ff:
        uVar20 = uVar12;
        uVar15 = (ulong)(int)uVar9;
        uVar18 = sequence->_M_string_length;
        uVar12 = uVar20;
        if (uVar18 - 3 <= uVar15) {
          uVar9 = uVar15 + 1;
          if (uVar18 - 2 == uVar9) {
            uVar14 = uVar18;
            uVar19 = uVar9;
            if (uVar18 <= uVar9) goto LAB_0016471c;
            pcVar3 = (sequence->_M_dataplus)._M_p;
            local_108 = 1;
            if (pcVar3[uVar9] == char1) {
              uVar1 = uVar15 + 2;
              uVar19 = uVar1;
              if (uVar18 <= uVar1) goto LAB_0016471c;
              cVar16 = (char)local_bc;
              cVar6 = (char)((int)uVar20 >> 0x1f);
              if (pcVar3[uVar1] == cVar16) {
                uVar19 = uVar15 + 3;
                uVar14 = local_88->_M_string_length;
                if (uVar14 <= uVar19) goto LAB_0016471c;
                pcVar4 = (local_88->_M_dataplus)._M_p;
                if (pcVar4[uVar19] == char1) goto LAB_00163788;
                uVar19 = uVar1;
                if (uVar14 <= uVar1) goto LAB_0016471c;
                local_108 = 1;
                if (pcVar4[uVar1] != cVar16) break;
                uVar19 = uVar9;
                if (uVar14 <= uVar9) goto LAB_0016471c;
                if (pcVar4[uVar9] != char1) break;
                if (uVar20 == 0) {
                  std::__cxx11::string::append((char *)&local_60);
                }
                else {
                  uVar12 = -uVar20;
                  if (0 < (int)uVar20) {
                    uVar12 = uVar20;
                  }
                  uVar17 = 1;
                  if (9 < uVar12) {
                    uVar14 = (ulong)uVar12;
                    uVar8 = 4;
                    do {
                      uVar17 = uVar8;
                      uVar7 = (uint)uVar14;
                      if (uVar7 < 100) {
                        uVar17 = uVar17 - 2;
                        goto LAB_00163c8c;
                      }
                      if (uVar7 < 1000) {
                        uVar17 = uVar17 - 1;
                        goto LAB_00163c8c;
                      }
                      if (uVar7 < 10000) goto LAB_00163c8c;
                      uVar14 = uVar14 / 10000;
                      uVar8 = uVar17 + 4;
                    } while (99999 < uVar7);
                    uVar17 = uVar17 + 1;
                  }
LAB_00163c8c:
                  local_b0[0] = local_a0;
                  std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar17 - cVar6);
                  local_b8 = (ulong)(uVar20 >> 0x1f);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            (local_b0[0] + local_b8,uVar17,uVar12);
                  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_b0);
                  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                  psVar13 = puVar11 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar11 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar13) {
                    local_100.field_2._M_allocated_capacity = *psVar13;
                    local_100.field_2._8_8_ = puVar11[3];
                  }
                  else {
                    local_100.field_2._M_allocated_capacity = *psVar13;
                    local_100._M_dataplus._M_p = (pointer)*puVar11;
                  }
                  local_100._M_string_length = puVar11[1];
                  *puVar11 = psVar13;
                  puVar11[1] = 0;
                  *(undefined1 *)(puVar11 + 2) = 0;
                  std::__cxx11::string::_M_append
                            ((char *)&local_60,(ulong)local_100._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_100._M_dataplus._M_p != &local_100.field_2) {
                    operator_delete(local_100._M_dataplus._M_p);
                  }
                  if (local_b0[0] != local_a0) {
                    operator_delete(local_b0[0]);
                  }
                  uVar20 = 1;
                  if (9 < uVar12) {
                    uVar17 = uVar12;
                    uVar8 = 4;
                    do {
                      uVar20 = uVar8;
                      if (uVar17 < 100) {
                        uVar20 = uVar20 - 2;
                        goto LAB_00163db2;
                      }
                      if (uVar17 < 1000) {
                        uVar20 = uVar20 - 1;
                        goto LAB_00163db2;
                      }
                      if (uVar17 < 10000) goto LAB_00163db2;
                      bVar5 = 99999 < uVar17;
                      uVar17 = uVar17 / 10000;
                      uVar8 = uVar20 + 4;
                    } while (bVar5);
                    uVar20 = uVar20 + 1;
                  }
LAB_00163db2:
                  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                  std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar20 - cVar6);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            (local_100._M_dataplus._M_p + local_b8,uVar20,uVar12);
                  std::__cxx11::string::_M_append
                            ((char *)&local_80,(ulong)local_100._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_100._M_dataplus._M_p != &local_100.field_2) {
                    operator_delete(local_100._M_dataplus._M_p);
                  }
                }
                std::__cxx11::string::push_back((char)&local_80);
LAB_0016418d:
                local_108 = 1;
                uVar9 = uVar15 + 2 & 0xffffffff;
                uVar12 = 0xffffffff;
              }
              else {
LAB_00163788:
                if (pcVar3[uVar9] == char1) {
                  uVar1 = uVar15 + 2;
                  uVar14 = uVar18;
                  uVar19 = uVar1;
                  if (uVar18 <= uVar1) {
LAB_0016471c:
                    std::__throw_out_of_range_fmt
                              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar19,uVar14);
                  }
                  if (pcVar3[uVar1] == char3) {
                    uVar19 = uVar15 + 3;
                    uVar14 = local_88->_M_string_length;
                    if (uVar14 <= uVar19) goto LAB_0016471c;
                    pcVar3 = (local_88->_M_dataplus)._M_p;
                    if (pcVar3[uVar19] != char1) {
                      uVar19 = uVar1;
                      if (uVar14 <= uVar1) goto LAB_0016471c;
                      if (pcVar3[uVar1] == cVar16) {
                        uVar19 = uVar9;
                        if (uVar14 <= uVar9) goto LAB_0016471c;
                        if (pcVar3[uVar9] == char1) {
                          if (uVar20 == 0) {
                            std::__cxx11::string::append((char *)&local_60);
                          }
                          else {
                            uVar12 = -uVar20;
                            if (0 < (int)uVar20) {
                              uVar12 = uVar20;
                            }
                            uVar17 = 1;
                            if (9 < uVar12) {
                              uVar14 = (ulong)uVar12;
                              uVar8 = 4;
                              do {
                                uVar17 = uVar8;
                                uVar7 = (uint)uVar14;
                                if (uVar7 < 100) {
                                  uVar17 = uVar17 - 2;
                                  goto LAB_00163fef;
                                }
                                if (uVar7 < 1000) {
                                  uVar17 = uVar17 - 1;
                                  goto LAB_00163fef;
                                }
                                if (uVar7 < 10000) goto LAB_00163fef;
                                uVar14 = uVar14 / 10000;
                                uVar8 = uVar17 + 4;
                              } while (99999 < uVar7);
                              uVar17 = uVar17 + 1;
                            }
LAB_00163fef:
                            local_b0[0] = local_a0;
                            std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar17 - cVar6)
                            ;
                            local_b8 = (ulong)(uVar20 >> 0x1f);
                            std::__detail::__to_chars_10_impl<unsigned_int>
                                      (local_b0[0] + local_b8,uVar17,uVar12);
                            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_b0);
                            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                            psVar13 = puVar11 + 2;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*puVar11 ==
                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)psVar13) {
                              local_100.field_2._M_allocated_capacity = *psVar13;
                              local_100.field_2._8_8_ = puVar11[3];
                            }
                            else {
                              local_100.field_2._M_allocated_capacity = *psVar13;
                              local_100._M_dataplus._M_p = (pointer)*puVar11;
                            }
                            local_100._M_string_length = puVar11[1];
                            *puVar11 = psVar13;
                            puVar11[1] = 0;
                            *(undefined1 *)(puVar11 + 2) = 0;
                            std::__cxx11::string::_M_append
                                      ((char *)&local_60,(ulong)local_100._M_dataplus._M_p);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
                              operator_delete(local_100._M_dataplus._M_p);
                            }
                            if (local_b0[0] != local_a0) {
                              operator_delete(local_b0[0]);
                            }
                            uVar20 = 1;
                            if (9 < uVar12) {
                              uVar17 = uVar12;
                              uVar8 = 4;
                              do {
                                uVar20 = uVar8;
                                if (uVar17 < 100) {
                                  uVar20 = uVar20 - 2;
                                  goto LAB_00164115;
                                }
                                if (uVar17 < 1000) {
                                  uVar20 = uVar20 - 1;
                                  goto LAB_00164115;
                                }
                                if (uVar17 < 10000) goto LAB_00164115;
                                bVar5 = 99999 < uVar17;
                                uVar17 = uVar17 / 10000;
                                uVar8 = uVar20 + 4;
                              } while (bVar5);
                              uVar20 = uVar20 + 1;
                            }
LAB_00164115:
                            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                            std::__cxx11::string::_M_construct
                                      ((ulong)&local_100,(char)uVar20 - cVar6);
                            std::__detail::__to_chars_10_impl<unsigned_int>
                                      (local_100._M_dataplus._M_p + local_b8,uVar20,uVar12);
                            std::__cxx11::string::_M_append
                                      ((char *)&local_80,(ulong)local_100._M_dataplus._M_p);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
                              operator_delete(local_100._M_dataplus._M_p);
                            }
                          }
                          std::__cxx11::string::push_back((char)&local_80);
                          goto LAB_0016418d;
                        }
                      }
                      local_108 = 1;
                      break;
                    }
                  }
                }
              }
            }
          }
          else {
            local_108 = local_108 & 0xff;
            if (uVar18 - 1 == uVar9) {
              local_108 = 0;
            }
          }
        }
      }
LAB_0016419b:
      uVar20 = uVar12;
      uVar12 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar12;
      uVar18 = (ulong)(int)uVar12;
      uVar14 = sequence->_M_string_length;
    } while (uVar18 < uVar14 - 2);
  }
  if (uVar20 - 1 < 0xfffffffe) {
    uVar20 = uVar20 + 2;
    uVar12 = -uVar20;
    if (0 < (int)uVar20) {
      uVar12 = uVar20;
    }
    uVar17 = 1;
    if (9 < uVar12) {
      uVar14 = (ulong)uVar12;
      uVar8 = 4;
      do {
        uVar17 = uVar8;
        uVar7 = (uint)uVar14;
        if (uVar7 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_00164315;
        }
        if (uVar7 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_00164315;
        }
        if (uVar7 < 10000) goto LAB_00164315;
        uVar14 = uVar14 / 10000;
        uVar8 = uVar17 + 4;
      } while (99999 < uVar7);
      uVar17 = uVar17 + 1;
    }
LAB_00164315:
    cVar6 = (char)((int)uVar20 >> 0x1f);
    paVar2 = &local_100.field_2;
    local_100._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar17 - cVar6);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_100._M_dataplus._M_p + (uVar20 >> 0x1f),uVar17,uVar12);
    std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_100._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    uVar17 = 1;
    if (9 < uVar12) {
      uVar14 = (ulong)uVar12;
      uVar8 = 4;
      do {
        uVar17 = uVar8;
        uVar7 = (uint)uVar14;
        if (uVar7 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_001643be;
        }
        if (uVar7 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_001643be;
        }
        if (uVar7 < 10000) goto LAB_001643be;
        uVar14 = uVar14 / 10000;
        uVar8 = uVar17 + 4;
      } while (99999 < uVar7);
      uVar17 = uVar17 + 1;
    }
LAB_001643be:
    local_100._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar17 - cVar6);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_100._M_dataplus._M_p + (uVar20 >> 0x1f),uVar17,uVar12);
    std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_100._M_dataplus._M_p);
  }
  else {
    if (uVar20 == 0xffffffff) goto LAB_00164611;
    if ((local_108 & 1) == 0) {
      uVar20 = uVar20 + 1;
      uVar12 = -uVar20;
      if (0 < (int)uVar20) {
        uVar12 = uVar20;
      }
      uVar17 = 1;
      if (9 < uVar12) {
        uVar14 = (ulong)uVar12;
        uVar8 = 4;
        do {
          uVar17 = uVar8;
          uVar7 = (uint)uVar14;
          if (uVar7 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_001644d1;
          }
          if (uVar7 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_001644d1;
          }
          if (uVar7 < 10000) goto LAB_001644d1;
          uVar14 = uVar14 / 10000;
          uVar8 = uVar17 + 4;
        } while (99999 < uVar7);
        uVar17 = uVar17 + 1;
      }
LAB_001644d1:
      cVar6 = (char)((int)uVar20 >> 0x1f);
      paVar2 = &local_100.field_2;
      local_100._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar17 - cVar6);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_100._M_dataplus._M_p + (uVar20 >> 0x1f),uVar17,uVar12);
      std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_100._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      uVar17 = 1;
      if (9 < uVar12) {
        uVar14 = (ulong)uVar12;
        uVar8 = 4;
        do {
          uVar17 = uVar8;
          uVar7 = (uint)uVar14;
          if (uVar7 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_001645c2;
          }
          if (uVar7 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_001645c2;
          }
          if (uVar7 < 10000) goto LAB_001645c2;
          uVar14 = uVar14 / 10000;
          uVar8 = uVar17 + 4;
        } while (99999 < uVar7);
        uVar17 = uVar17 + 1;
      }
LAB_001645c2:
      local_100._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar17 - cVar6);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_100._M_dataplus._M_p + (uVar20 >> 0x1f),uVar17,uVar12);
      std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_100._M_dataplus._M_p);
    }
    else {
      uVar20 = uVar20 + 2;
      uVar12 = -uVar20;
      if (0 < (int)uVar20) {
        uVar12 = uVar20;
      }
      uVar17 = 1;
      if (9 < uVar12) {
        uVar14 = (ulong)uVar12;
        uVar8 = 4;
        do {
          uVar17 = uVar8;
          uVar7 = (uint)uVar14;
          if (uVar7 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_00164415;
          }
          if (uVar7 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_00164415;
          }
          if (uVar7 < 10000) goto LAB_00164415;
          uVar14 = uVar14 / 10000;
          uVar8 = uVar17 + 4;
        } while (99999 < uVar7);
        uVar17 = uVar17 + 1;
      }
LAB_00164415:
      cVar6 = (char)((int)uVar20 >> 0x1f);
      paVar2 = &local_100.field_2;
      local_100._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar17 - cVar6);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_100._M_dataplus._M_p + (uVar20 >> 0x1f),uVar17,uVar12);
      std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_100._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      uVar17 = 1;
      if (9 < uVar12) {
        uVar14 = (ulong)uVar12;
        uVar8 = 4;
        do {
          uVar17 = uVar8;
          uVar7 = (uint)uVar14;
          if (uVar7 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_0016457e;
          }
          if (uVar7 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_0016457e;
          }
          if (uVar7 < 10000) goto LAB_0016457e;
          uVar14 = uVar14 / 10000;
          uVar8 = uVar17 + 4;
        } while (99999 < uVar7);
        uVar17 = uVar17 + 1;
      }
LAB_0016457e:
      local_100._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar17 - cVar6);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_100._M_dataplus._M_p + (uVar20 >> 0x1f),uVar17,uVar12);
      std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_100._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
LAB_00164611:
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_100,local_60,local_60 + local_58);
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char*>((string *)local_e0,local_80,local_80 + local_78);
  __l._M_len = 2;
  __l._M_array = &local_100;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_38,__l,(allocator_type *)local_b0);
  lVar21 = 0;
  do {
    if (local_d0 + lVar21 != *(undefined1 **)((long)local_e0 + lVar21)) {
      operator_delete(*(undefined1 **)((long)local_e0 + lVar21));
    }
    lVar21 = lVar21 + -0x20;
  } while (lVar21 != -0x40);
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return local_38;
}

Assistant:

std::vector<string> CTandCTOTReadCoder(string reference,string sequence,vector<int> qualityList,char char1,char char2,char char3){

    string codedRead = "";
    string codedReadQualities = "";
    bool endChecker;
    int counter = 0;

    for(int i =0; i<sequence.size()-2 ; i++){
        counter ++;
        if((sequence.at(i)==char1) && (sequence.at(i+1)==char2) && (sequence.at(i+2)!=char1)){
            if(reference.at(i+1)!=char2 || reference.at(i)!=char1){
                continue;
            }

            if(counter == 1){
                codedRead += "O";
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }else{
                codedRead += std::to_string(counter-1) + "O";
                codedReadQualities += std::to_string(counter-1);
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }
            i += 1;
            counter = 0;
        }else if((sequence.at(i)==char1) && (sequence.at(i+1)==char3) && (sequence.at(i+2)!=char1)){
            if(reference.at(i+1)!=char2 || reference.at(i)!=char1){
                continue;
            }
            if(counter == 1){
                codedRead += "C";
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }else{
                codedRead += std::to_string(counter-1) + "C";
                codedReadQualities += std::to_string(counter-1);
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }

            i += 1;
            counter = 0;
        }
        //This portion is specifically for calculating the last three nucleotides in the read sequence
        if(i>=sequence.size()-3){
            i++;
            if(i==sequence.size()-2){
                endChecker = true;
                if((sequence.at(i)==char1) && (sequence.at(i+1)==char2) && (reference.at(i+2)!=char1)){
                    counter++;
                    if(reference.at(i+1)!=char2 || reference.at(i)!=char1){
                        counter-=1;
                        break;
                    }
                    if(counter == 1){
                        codedRead += "O";
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }else{
                        codedRead += std::to_string(counter-1) + "O";
                        codedReadQualities += std::to_string(counter-1);
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }
                    i += 1;
                    counter = -1;

                }else if((sequence.at(i)==char1) && (sequence.at(i+1)==char3) && (reference.at(i+2)!=char1)){
                    counter++;
                    if(reference.at(i+1)!=char2|| reference.at(i)!=char1){
                        counter-=1;
                        break;
                    }
                    if(counter == 1){
                        codedRead += "C";
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }else{
                        codedRead += std::to_string(counter-1) + "C";
                        codedReadQualities += std::to_string(counter-1);
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }

                    i += 1;
                    counter = -1;
                }

            }else if(i==sequence.size()-1){
                endChecker = false;
            }
        }

    }
    if(counter!=0 && counter!=-1){
        codedRead += std::to_string(counter+2);
        codedReadQualities += std::to_string(counter+2);
    }else if(counter!=-1){
        if(endChecker){
            codedRead += std::to_string(counter+2);
            codedReadQualities += std::to_string(counter+2);
        }else{
            codedRead += std::to_string(counter+1);
            codedReadQualities += std::to_string(counter+1);
        }
    }

    return {codedRead,codedReadQualities};

}